

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O3

void __thiscall soul::heart::Parser::parseTopLevelItems(Parser *this,ScannedTopLevelItem *item)

{
  char *pcVar1;
  Module *pMVar2;
  char *pcVar3;
  pointer pUVar4;
  pointer pUVar5;
  ulong uVar6;
  
  pcVar1 = (this->
           super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
           ).location.location.data;
  pUVar4 = (item->inputDecls).
           super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((item->inputDecls).super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>.
      _M_impl.super__Vector_impl_data._M_finish != pUVar4) {
    uVar6 = 0;
    do {
      if ((this->
          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ).input.data != pUVar4[uVar6].data) {
        (this->
        super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        ).input.data = pUVar4[uVar6].data;
        Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        ::skip(&this->
                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
              );
      }
      pMVar2 = (this->module).object;
      if (pMVar2 == (Module *)0x0) goto LAB_0022efa7;
      parseInput(this,(pMVar2->inputs).
                      super__Vector_base<soul::pool_ref<soul::heart::InputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::InputDeclaration>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar6].object);
      uVar6 = uVar6 + 1;
      pUVar4 = (item->inputDecls).
               super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar6 < (ulong)((long)(item->inputDecls).
                                   super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar4 >> 3));
  }
  pUVar4 = (item->outputDecls).
           super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((item->outputDecls).super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>.
      _M_impl.super__Vector_impl_data._M_finish != pUVar4) {
    uVar6 = 0;
    do {
      if ((this->
          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ).input.data != pUVar4[uVar6].data) {
        (this->
        super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        ).input.data = pUVar4[uVar6].data;
        Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        ::skip(&this->
                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
              );
      }
      pMVar2 = (this->module).object;
      if (pMVar2 == (Module *)0x0) goto LAB_0022efa7;
      parseOutput(this,(pMVar2->outputs).
                       super__Vector_base<soul::pool_ref<soul::heart::OutputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::OutputDeclaration>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar6].object);
      uVar6 = uVar6 + 1;
      pUVar4 = (item->outputDecls).
               super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar6 < (ulong)((long)(item->outputDecls).
                                   super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar4 >> 3));
  }
  pUVar4 = (item->functionBodyCode).
           super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>._M_impl.
           super__Vector_impl_data._M_start;
  pUVar5 = (item->functionBodyCode).
           super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pUVar5 != pUVar4) {
    uVar6 = 0;
    do {
      pcVar3 = pUVar4[uVar6].data;
      if (pcVar3 != (char *)0x0) {
        if ((this->
            super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
            ).input.data != pcVar3) {
          (this->
          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ).input.data = pcVar3;
          Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::skip(&this->
                  super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                );
        }
        pMVar2 = (this->module).object;
        if (pMVar2 == (Module *)0x0) {
LAB_0022efa7:
          throwInternalCompilerError("object != nullptr","operator->",0x3c);
        }
        if ((pMVar2->functions).functions.numActive <= uVar6) {
          throwInternalCompilerError("index < numActive","operator[]",0x9f);
        }
        parseFunctionBody(this,(pMVar2->functions).functions.items[uVar6].object);
        pUVar4 = (item->functionBodyCode).
                 super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pUVar5 = (item->functionBodyCode).
                 super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < (ulong)((long)pUVar5 - (long)pUVar4 >> 3));
  }
  if ((this->
      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
      ).input.data != pcVar1) {
    (this->
    super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
    ).input.data = pcVar1;
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    skip(&this->
          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        );
    return;
  }
  return;
}

Assistant:

void parseTopLevelItems (ScannedTopLevelItem& item)
    {
        auto nextItemPos = getCurrentTokeniserPosition();

        for (size_t i = 0; i < item.inputDecls.size(); ++i)
        {
            resetPosition (item.inputDecls[i]);
            parseInput (module->inputs[i]);
        }

        for (size_t i = 0; i < item.outputDecls.size(); ++i)
        {
            resetPosition (item.outputDecls[i]);
            parseOutput (module->outputs[i]);
        }

        for (size_t i = 0; i < item.functionBodyCode.size(); ++i)
        {
            if (item.functionBodyCode[i] != UTF8Reader())
            {
                resetPosition (item.functionBodyCode[i]);
                parseFunctionBody (module->functions.at (i));
            }
        }

        resetPosition (nextItemPos);
    }